

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::CalendarAstronomer::Equatorial::toString
          (UnicodeString *__return_storage_ptr__,Equatorial *this)

{
  Equatorial *this_local;
  
  UnicodeString::UnicodeString(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString CalendarAstronomer::Equatorial::toString() const
{
#ifdef U_DEBUG_ASTRO
    char tmp[400];
    sprintf(tmp, "%f,%f",
        (ascension*RAD_DEG), (declination*RAD_DEG));
    return UnicodeString(tmp, "");
#else
    return UnicodeString();
#endif
}